

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_search.c
# Opt level: O0

void tx_partition_set_contexts(AV1_COMMON *cm,MACROBLOCKD *xd,BLOCK_SIZE plane_bsize)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  byte in_DL;
  uint *in_RSI;
  long in_RDI;
  int idx;
  int idy;
  int bw;
  int bh;
  int in_stack_00000018;
  TX_SIZE max_tx_size;
  int mi_height;
  int mi_width;
  int in_stack_ffffffffffffffd0;
  int iVar4;
  undefined4 in_stack_ffffffffffffffd4;
  int iVar5;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  int iVar6;
  
  bVar1 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[in_DL];
  bVar2 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[in_DL];
  iVar3 = get_vartx_max_txsize
                    ((MACROBLOCKD *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                     (BLOCK_SIZE)((uint)in_stack_ffffffffffffffd4 >> 0x18),in_stack_ffffffffffffffd0
                    );
  iVar6 = tx_size_high_unit[(byte)iVar3];
  iVar3 = tx_size_wide_unit[(byte)iVar3];
  *(long *)(in_RSI + 0x7f0) =
       *(long *)(*(long *)(in_RDI + 0x6318) + (long)(int)in_RSI[0x7ac] * 8) + (long)(int)in_RSI[1];
  *(long *)(in_RSI + 0x7f2) = (long)in_RSI + (long)(int)(*in_RSI & 0x1f) + 0x1fd0;
  for (iVar5 = 0; iVar5 < (int)(uint)bVar2; iVar5 = iVar6 + iVar5) {
    for (iVar4 = 0; iVar4 < (int)(uint)bVar1; iVar4 = iVar3 + iVar4) {
      set_txfm_context((MACROBLOCKD *)CONCAT17(plane_bsize,_mi_width),mi_height._3_1_,
                       in_stack_00000018,bh);
    }
  }
  return;
}

Assistant:

static void tx_partition_set_contexts(const AV1_COMMON *const cm,
                                      MACROBLOCKD *xd, BLOCK_SIZE plane_bsize) {
  const int mi_width = mi_size_wide[plane_bsize];
  const int mi_height = mi_size_high[plane_bsize];
  const TX_SIZE max_tx_size = get_vartx_max_txsize(xd, plane_bsize, 0);
  const int bh = tx_size_high_unit[max_tx_size];
  const int bw = tx_size_wide_unit[max_tx_size];

  xd->above_txfm_context =
      cm->above_contexts.txfm[xd->tile.tile_row] + xd->mi_col;
  xd->left_txfm_context =
      xd->left_txfm_context_buffer + (xd->mi_row & MAX_MIB_MASK);

  for (int idy = 0; idy < mi_height; idy += bh) {
    for (int idx = 0; idx < mi_width; idx += bw) {
      set_txfm_context(xd, max_tx_size, idy, idx);
    }
  }
}